

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d021dd::HandleCacheMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  string *this;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  bool bVar2;
  reference key;
  cmMakefile *pcVar3;
  cmState *this_00;
  cmAlphaNum local_298;
  cmAlphaNum local_268;
  string local_238;
  cmValue local_218;
  cmValue existingValue;
  cmake *cm;
  string *name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_1b8;
  string local_188;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  string local_108;
  cmAlphaNum local_d8;
  cmAlphaNum local_a8;
  string local_78;
  string_view local_58;
  string_view local_48;
  byte local_33;
  byte local_32;
  byte local_31;
  bool remove_local;
  bool appendMode_local;
  string *psStack_30;
  bool appendAsString_local;
  string *propertyValue_local;
  string *propertyName_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  cmExecutionStatus *status_local;
  
  local_33 = remove;
  local_32 = appendMode;
  local_31 = appendAsString;
  psStack_30 = propertyValue;
  propertyValue_local = propertyName;
  propertyName_local = (string *)names;
  names_local = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)status;
  bVar2 = std::operator==(propertyName,"ADVANCED");
  if (bVar2) {
    if ((local_33 & 1) == 0) {
      local_48 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_30);
      bVar2 = cmIsOn(local_48);
      if (!bVar2) {
        local_58 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_30);
        bVar2 = cmIsOff(local_58);
        psVar1 = names_local;
        if (!bVar2) {
          cmAlphaNum::cmAlphaNum(&local_a8,"given non-boolean value \"");
          cmAlphaNum::cmAlphaNum(&local_d8,psStack_30);
          cmStrCat<char[35]>(&local_78,&local_a8,&local_d8,
                             (char (*) [35])"\" for CACHE property \"ADVANCED\".  ");
          cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          return false;
        }
      }
    }
  }
  else {
    bVar2 = std::operator==(propertyValue_local,"TYPE");
    if (bVar2) {
      bVar2 = cmState::IsCacheEntryType(psStack_30);
      psVar1 = names_local;
      if (!bVar2) {
        cmAlphaNum::cmAlphaNum(&local_138,"given invalid CACHE entry TYPE \"");
        cmAlphaNum::cmAlphaNum(&local_168,psStack_30);
        cmStrCat<char[2]>(&local_108,&local_138,&local_168,(char (*) [2])0xd61012);
        cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        return false;
      }
    }
    else {
      bVar2 = std::operator!=(propertyValue_local,"HELPSTRING");
      if (bVar2) {
        bVar2 = std::operator!=(propertyValue_local,"STRINGS");
        if (bVar2) {
          bVar2 = std::operator!=(propertyValue_local,"VALUE");
          psVar1 = names_local;
          if (bVar2) {
            cmAlphaNum::cmAlphaNum(&local_1b8,"given invalid CACHE property ");
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,propertyValue_local);
            cmStrCat<char[82]>(&local_188,&local_1b8,(cmAlphaNum *)&__range1,
                               (char (*) [82])
                               ".  Settable CACHE properties are: ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."
                              );
            cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            return false;
          }
        }
      }
    }
  }
  this = propertyName_local;
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)propertyName_local);
  name = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&name);
    if (!bVar2) {
      return true;
    }
    key = std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)names_local);
    existingValue.Value = (string *)cmMakefile::GetCMakeInstance(pcVar3);
    this_00 = cmake::GetState((cmake *)existingValue.Value);
    local_218 = cmState::GetCacheEntryValue(this_00,key);
    bVar2 = cmValue::operator_cast_to_bool(&local_218);
    psVar1 = names_local;
    if (!bVar2) break;
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)names_local);
    bVar2 = HandleCacheEntry(key,pcVar3,propertyValue_local,psStack_30,(bool)(local_31 & 1),
                             (bool)(local_32 & 1),(bool)(local_33 & 1));
    if (!bVar2) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  cmAlphaNum::cmAlphaNum(&local_268,"could not find CACHE variable ");
  cmAlphaNum::cmAlphaNum(&local_298,key);
  cmStrCat<char[40]>(&local_238,&local_268,&local_298,
                     (char (*) [40])".  Perhaps it has not yet been created.");
  cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  return false;
}

Assistant:

bool HandleCacheMode(cmExecutionStatus& status,
                     const std::set<std::string>& names,
                     const std::string& propertyName,
                     const std::string& propertyValue, bool appendAsString,
                     bool appendMode, bool remove)
{
  if (propertyName == "ADVANCED") {
    if (!remove && !cmIsOn(propertyValue) && !cmIsOff(propertyValue)) {
      status.SetError(cmStrCat("given non-boolean value \"", propertyValue,
                               R"(" for CACHE property "ADVANCED".  )"));
      return false;
    }
  } else if (propertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(propertyValue)) {
      status.SetError(
        cmStrCat("given invalid CACHE entry TYPE \"", propertyValue, "\""));
      return false;
    }
  } else if (propertyName != "HELPSTRING" && propertyName != "STRINGS" &&
             propertyName != "VALUE") {
    status.SetError(
      cmStrCat("given invalid CACHE property ", propertyName,
               ".  "
               "Settable CACHE properties are: "
               "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE."));
    return false;
  }

  for (std::string const& name : names) {
    // Get the source file.
    cmake* cm = status.GetMakefile().GetCMakeInstance();
    cmValue existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!HandleCacheEntry(name, status.GetMakefile(), propertyName,
                            propertyValue, appendAsString, appendMode,
                            remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find CACHE variable ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}